

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitAtomicNotify(BinaryInstWriter *this,AtomicNotify *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined8 in_RAX;
  undefined1 auStack_28 [7];
  uchar local_21;
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  auStack_28 = SUB87(in_RAX,0);
  _auStack_28 = CONCAT17(0xfe,auStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_21);
  auStack_28 = (undefined1  [7])CONCAT16(0,auStack_28._0_6_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,auStack_28 + 6);
  emitMemoryAccess(this,4,4,(curr->offset).addr,(Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicNotify(AtomicNotify* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix) << int8_t(BinaryConsts::AtomicNotify);
  emitMemoryAccess(4, 4, curr->offset, curr->memory);
}